

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O0

uint TTA::Merge(uint u,uint v)

{
  uint uVar1;
  uint local_1c;
  uint local_18;
  uint i_1;
  uint i;
  uint v_local;
  uint u_local;
  
  v_local = rtable_[u];
  uVar1 = rtable_[v];
  local_18 = uVar1;
  if (v_local < uVar1) {
    for (; local_18 != 0xffffffff; local_18 = next_[local_18]) {
      rtable_[local_18] = v_local;
    }
    next_[tail_[v_local]] = uVar1;
    tail_[v_local] = tail_[uVar1];
  }
  else {
    local_1c = v_local;
    if (uVar1 < v_local) {
      for (; local_1c != 0xffffffff; local_1c = next_[local_1c]) {
        rtable_[local_1c] = uVar1;
      }
      next_[tail_[uVar1]] = v_local;
      tail_[uVar1] = tail_[v_local];
      v_local = uVar1;
    }
  }
  return v_local;
}

Assistant:

static unsigned Merge(unsigned u, unsigned v)
    {
        // FindRoot(u);
        u = rtable_[u];
        // FindRoot(v);
        v = rtable_[v];

        if (u < v) {
            unsigned i = v;
            while (i != UINT_MAX) {
                rtable_[i] = u;
                i = next_[i];
            }
            next_[tail_[u]] = v;
            tail_[u] = tail_[v];
            return u;
        }
        else if (u > v) {
            unsigned i = u;
            while (i != UINT_MAX) {
                rtable_[i] = v;
                i = next_[i];
            }
            next_[tail_[v]] = u;
            tail_[v] = tail_[u];
            return v;
        }

        return u;  // equal to v
    }